

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall
OpenMesh::PropertyT<OpenMesh::VectorT<unsigned_char,_3>_>::clear
          (PropertyT<OpenMesh::VectorT<unsigned_char,_3>_> *this)

{
  vector<OpenMesh::VectorT<unsigned_char,_3>,_std::allocator<OpenMesh::VectorT<unsigned_char,_3>_>_>
  local_28;
  PropertyT<OpenMesh::VectorT<unsigned_char,_3>_> *local_10;
  PropertyT<OpenMesh::VectorT<unsigned_char,_3>_> *this_local;
  
  local_10 = this;
  std::
  vector<OpenMesh::VectorT<unsigned_char,_3>,_std::allocator<OpenMesh::VectorT<unsigned_char,_3>_>_>
  ::clear(&this->data_);
  memset(&local_28,0,0x18);
  std::
  vector<OpenMesh::VectorT<unsigned_char,_3>,_std::allocator<OpenMesh::VectorT<unsigned_char,_3>_>_>
  ::vector(&local_28);
  std::
  vector<OpenMesh::VectorT<unsigned_char,_3>,_std::allocator<OpenMesh::VectorT<unsigned_char,_3>_>_>
  ::swap(&local_28,&this->data_);
  std::
  vector<OpenMesh::VectorT<unsigned_char,_3>,_std::allocator<OpenMesh::VectorT<unsigned_char,_3>_>_>
  ::~vector(&local_28);
  return;
}

Assistant:

virtual void clear()  { data_.clear(); vector_type().swap(data_);    }